

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isValidForSequence(Type *this)

{
  bool bVar1;
  Type *this_00;
  
  this_00 = getCanonicalType(this);
  bVar1 = isIntegral(this_00);
  if (!bVar1) {
    bVar1 = isString(this_00);
    if (!bVar1) {
      bVar1 = isFloating(this_00);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool Type::isValidForSequence() const {
    // Type must be cast compatible with an integral type to be valid.
    auto& ct = getCanonicalType();
    return ct.isIntegral() || ct.isString() || ct.isFloating();
}